

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O1

Light * rw::Light::create(int32 type)

{
  Light *object;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/light.cpp line: 35";
  object = (Light *)(*Engine::memfuncs)((long)s_plglist,0x30012);
  if (object == (Light *)0x0) {
    create();
    object = (Light *)0x0;
  }
  else {
    numAllocated = numAllocated + 1;
    (object->object).object.type = '\x03';
    (object->object).object.subType = (uint8)type;
    (object->object).object.parent = (void *)0x0;
    object->radius = 0.0;
    (object->color).red = 1.0;
    (object->color).green = 1.0;
    (object->color).blue = 1.0;
    *(undefined8 *)&(object->color).alpha = 0x3f8000003f800000;
    (object->object).object.flags = '\x03';
    (object->object).object.privateFlags = '\0';
    (object->object).object.privateFlags = '\x01';
    (object->inWorld).next = (LLLink *)0x0;
    (object->inWorld).prev = (LLLink *)0x0;
    object->clump = (Clump *)0x0;
    (object->inClump).next = (LLLink *)0x0;
    (object->inClump).prev = (LLLink *)0x0;
    object->world = (World *)0x0;
    object->originalSync = lightSync;
    (object->object).syncCB = worldLightSync;
    PluginList::construct((PluginList *)&s_plglist,object);
  }
  return object;
}

Assistant:

Light*
Light::create(int32 type)
{
	Light *light = (Light*)rwMalloc(s_plglist.size, MEMDUR_EVENT | ID_LIGHT);
	if(light == nil){
		RWERROR((ERR_ALLOC, s_plglist.size));
		return nil;
	}
	numAllocated++;
	light->object.object.init(Light::ID, type);
	light->object.syncCB = lightSync;
	light->radius = 0.0f;
	light->color.red = 1.0f;
	light->color.green = 1.0f;
	light->color.blue = 1.0f;
	light->color.alpha = 1.0f;
	light->minusCosAngle = 1.0f;
	light->object.object.privateFlags = 1;
	light->object.object.flags = LIGHTATOMICS | LIGHTWORLD;
	light->inWorld.init();

	// clump extension
	light->clump = nil;
	light->inClump.init();

	// world extension
	light->world = nil;
	light->originalSync = light->object.syncCB;
	light->object.syncCB = worldLightSync;

	s_plglist.construct(light);
	return light;
}